

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

BigInteger * __thiscall BigInteger::operator-=(BigInteger *this,BigInteger *a)

{
  this->negative = (bool)(this->negative ^ 1);
  operator+=(this,a);
  this->negative = (bool)(this->negative ^ 1);
  normalize(this);
  return this;
}

Assistant:

BigInteger &BigInteger::operator-=(const BigInteger &a) noexcept
{
    negative ^= 1;
    *this += a;
    negative ^= 1;
    normalize();
    return *this;
}